

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O1

void __thiscall mocker::ir::AttachedComment::~AttachedComment(AttachedComment *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__AttachedComment_001f1910;
  pcVar2 = (this->str)._M_dataplus._M_p;
  paVar1 = &(this->str).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit AttachedComment(std::string str)
      : IRInst(InstType::AttachedComment), str(std::move(str)) {}